

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O0

void cppcms::impl::string_map::insert
               (vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                *d,entry *e,int *first)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  size_type sVar4;
  reference pvVar5;
  int *in_RDX;
  undefined8 *in_RSI;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_> *in_RDI;
  int pos;
  int local_1c;
  
  uVar1 = *(uint *)(in_RSI + 2);
  sVar4 = std::
          vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
          ::size(in_RDI);
  local_1c = (int)((ulong)uVar1 % sVar4);
  while( true ) {
    pvVar5 = std::
             vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
             ::operator[](in_RDI,(long)local_1c);
    if (pvVar5->key == (char *)0x0) break;
    sVar4 = std::
            vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
            ::size(in_RDI);
    local_1c = (int)((ulong)(long)(local_1c + 1) % sVar4);
  }
  pvVar5 = std::
           vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
           ::operator[](in_RDI,(long)local_1c);
  pvVar5->key = (char *)*in_RSI;
  pvVar5->value = (char *)in_RSI[1];
  uVar3 = in_RSI[2];
  pvVar5->hash = (int)uVar3;
  pvVar5->next_index = (int)((ulong)uVar3 >> 0x20);
  iVar2 = *in_RDX;
  pvVar5 = std::
           vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
           ::operator[](in_RDI,(long)local_1c);
  pvVar5->next_index = iVar2;
  *in_RDX = local_1c;
  return;
}

Assistant:

static void insert(std::vector<entry> &d,entry const &e,int &first)
			{
				int pos = e.hash % d.size();
				while(d[pos].key)
					pos = (pos + 1) % d.size();
				d[pos] = e;
				d[pos].next_index = first;
				first = pos;
			}